

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateAssignment(ExpressionEvalContext *ctx,ExprAssignment *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  ExprBase *value;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar7 = Evaluate(ctx,expression->lhs);
      value = Evaluate(ctx,expression->rhs);
      if ((value != (ExprBase *)0x0 && pEVar7 != (ExprBase *)0x0) &&
         (bVar5 = CreateStore(ctx,pEVar7,value), bVar5)) {
        pEVar7 = CheckType(&expression->super_ExprBase,value);
        return pEVar7;
      }
    }
    else {
      Report(ctx,"ERROR: instruction limit reached");
    }
    pEVar7 = (ExprBase *)0x0;
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar3;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
  }
  return pEVar7;
}

Assistant:

ExprBase* EvaluateAssignment(ExpressionEvalContext &ctx, ExprAssignment *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *lhs = Evaluate(ctx, expression->lhs);
	ExprBase *rhs = Evaluate(ctx, expression->rhs);

	if(!lhs || !rhs)
		return NULL;

	if(!CreateStore(ctx, lhs, rhs))
		return NULL;

	return CheckType(expression, rhs);
}